

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_frint_mode(DisasContext_conflict1 *s,arg_rpr_esz *a,int mode)

{
  int iVar1;
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i32 retval;
  TCGv_ptr arg2;
  uintptr_t o;
  uintptr_t o_1;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      oprsz = s->sve_len;
      retval = tcg_const_i32_aarch64(tcg_ctx,mode);
      arg2 = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
      gen_helper_set_rmode(tcg_ctx,retval,retval,arg2);
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->pg * 0x20 + 0x2c10,arg2,
                 oprsz,oprsz,0,trans_FCMLA_zzxz::fns[(long)a->esz + 1]);
      gen_helper_set_rmode(tcg_ctx,retval,retval,arg2);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool do_frint_mode(DisasContext *s, arg_rpr_esz *a, int mode)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_i32 tmode = tcg_const_i32(tcg_ctx, mode);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

        gen_helper_set_rmode(tcg_ctx, tmode, tmode, status);

        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           pred_full_reg_offset(s, a->pg),
                           status, vsz, vsz, 0, frint_fns[a->esz - 1]);

        gen_helper_set_rmode(tcg_ctx, tmode, tmode, status);
        tcg_temp_free_i32(tcg_ctx, tmode);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}